

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

bool i4_is_triangular(int i)

{
  int local_20;
  int local_1c;
  int j;
  int k;
  
  if (i < 0) {
    return false;
  }
  if (i != 0) {
    i4_to_triangle(i,&local_20,&local_1c);
    return local_20 == local_1c;
  }
  return true;
}

Assistant:

bool i4_is_triangular ( int i )

//****************************************************************************80
//
//  Purpose:
//
//    I4_IS_TRIANGULAR determines whether an I4 is triangular.
//
//  Discussion:
//
//    The N-th triangular number is equal to the sum of the first
//    N integers.
//
//  First Values:
//
//    Index  Value
//     0      0
//     1      1
//     2      3
//     3      6
//     4     10
//     5     15
//     6     21
//     7     28
//     8     36
//     9     45
//    10     55
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    19 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int I, the integer to be checked.
//
//    Output, bool I4_IS_TRIANGULAR, is TRUE if I is triangular.
//
{
  int j;
  int k;

  if ( i < 0 )
  {
    return false;
  }
  else if ( i == 0 )
  {
    return true;
  }
  else
  {
    i4_to_triangle ( i, &j, &k );

    if ( j == k )
    {
      return true;
    }
    else
    {
      return false;
    }
  }

}